

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O0

void __thiscall amrex::ErrorRec::~ErrorRec(ErrorRec *this)

{
  void *in_RDI;
  ErrorRec *unaff_retaddr;
  
  ~ErrorRec(unaff_retaddr);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

ErrorRec::~ErrorRec()
{
    delete err_func;
    delete err_func2;
}